

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O1

vector<FBX::Node,_std::allocator<FBX::Node>_> *
FBX::findNodes(vector<FBX::Node,_std::allocator<FBX::Node>_> *__return_storage_ptr__,Node *node,
              string *nodeId)

{
  value_type *pvVar1;
  size_t __n;
  int iVar2;
  Node *e;
  value_type *__x;
  
  (__return_storage_ptr__->super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (node->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (node->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    __n = (__x->id)._M_string_length;
    if ((__n == nodeId->_M_string_length) &&
       ((__n == 0 ||
        (iVar2 = bcmp((__x->id)._M_dataplus._M_p,(nodeId->_M_dataplus)._M_p,__n), iVar2 == 0)))) {
      std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back(__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Node> findNodes(const Node &node, const std::string &nodeId) {
        std::vector<Node> nodes;

        for (const Node &e : node.children)
            if (e.id == nodeId)
                nodes.push_back(e);
        return nodes;
    }